

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_t * create_natpmp_ann_msg(pcp_server_t *s)

{
  pcp_flow_t *ppVar1;
  undefined1 local_5c [8];
  flow_key_data kd;
  pcp_server_t *s_local;
  
  kd.field_5._16_8_ = s;
  memset(local_5c,0,0x4c);
  unique0x00012000 = *(undefined8 *)(kd.field_5._16_8_ + 0x24);
  kd.src_ip.__in6_u._0_8_ = *(undefined8 *)(kd.field_5._16_8_ + 0x2c);
  kd.src_ip.__in6_u._8_8_ = *(undefined8 *)(kd.field_5._16_8_ + 0xc);
  kd.pcp_server_ip.__in6_u._0_8_ = *(undefined8 *)(kd.field_5._16_8_ + 0x14);
  kd._32_8_ = *(undefined8 *)(kd.field_5._16_8_ + 0x100);
  kd.nonce.n[0] = *(uint32_t *)(kd.field_5._16_8_ + 0x108);
  local_5c[0] = '\0';
  ppVar1 = pcp_create_flow((pcp_server_t *)kd.field_5._16_8_,(flow_key_data *)local_5c);
  *(pcp_flow_t **)(kd.field_5._16_8_ + 0x110) = ppVar1;
  pcp_db_add_flow(*(pcp_flow_t **)(kd.field_5._16_8_ + 0x110));
  return *(pcp_flow_t **)(kd.field_5._16_8_ + 0x110);
}

Assistant:

static inline pcp_flow_t *create_natpmp_ann_msg(pcp_server_t *s) {
    struct flow_key_data kd;

    memset(&kd, 0, sizeof(kd));
    memcpy(&kd.src_ip, s->src_ip, sizeof(kd.src_ip));
    memcpy(&kd.pcp_server_ip, s->pcp_ip, sizeof(kd.pcp_server_ip));
    memcpy(&kd.nonce, &s->nonce, sizeof(kd.nonce));
    kd.operation = NATPMP_OPCODE_ANNOUNCE;

    s->ping_flow_msg = pcp_create_flow(s, &kd);
    pcp_db_add_flow(s->ping_flow_msg);

    return s->ping_flow_msg;
}